

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VAOCache.cpp
# Opt level: O3

void __thiscall Diligent::VAOCache::OnDestroyPSO(VAOCache *this,PipelineStateGLImpl *PSO)

{
  unordered_map<int,_std::vector<Diligent::VAOCache::VAOHashKey,_std::allocator<Diligent::VAOCache::VAOHashKey>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<Diligent::VAOCache::VAOHashKey,_std::allocator<Diligent::VAOCache::VAOHashKey>_>_>_>_>
  *this_00;
  VAOHashKey *pVVar1;
  pointer pVVar2;
  byte bVar3;
  iterator __it;
  VAOHashKey *Key;
  VAOHashKey *__args;
  vector<Diligent::VAOCache::VAOHashKey,_std::allocator<Diligent::VAOCache::VAOHashKey>_> StaleKeys;
  vector<Diligent::VAOCache::VAOHashKey,_std::allocator<Diligent::VAOCache::VAOHashKey>_> local_58;
  _Hashtable<int,_std::pair<const_int,_std::vector<Diligent::VAOCache::VAOHashKey,_std::allocator<Diligent::VAOCache::VAOHashKey>_>_>,_std::allocator<std::pair<const_int,_std::vector<Diligent::VAOCache::VAOHashKey,_std::allocator<Diligent::VAOCache::VAOHashKey>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_40;
  Int32 local_34;
  
  local_58.
  super__Vector_base<Diligent::VAOCache::VAOHashKey,_std::allocator<Diligent::VAOCache::VAOHashKey>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<Diligent::VAOCache::VAOHashKey,_std::allocator<Diligent::VAOCache::VAOHashKey>_>
  ._M_impl.super__Vector_impl_data._M_finish = (VAOHashKey *)0x0;
  local_58.
  super__Vector_base<Diligent::VAOCache::VAOHashKey,_std::allocator<Diligent::VAOCache::VAOHashKey>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (VAOHashKey *)0x0;
  LOCK();
  bVar3 = (this->m_CacheLock).m_IsLocked._M_base._M_i;
  (this->m_CacheLock).m_IsLocked._M_base._M_i = true;
  UNLOCK();
  while ((bVar3 & 1) != 0) {
    Threading::SpinLock::Wait(&this->m_CacheLock);
    LOCK();
    bVar3 = (this->m_CacheLock).m_IsLocked._M_base._M_i;
    (this->m_CacheLock).m_IsLocked._M_base._M_i = true;
    UNLOCK();
  }
  local_34 = DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
             ::GetUniqueID((DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
                            *)PSO);
  this_00 = &this->m_PSOToKey;
  __it = std::
         _Hashtable<int,_std::pair<const_int,_std::vector<Diligent::VAOCache::VAOHashKey,_std::allocator<Diligent::VAOCache::VAOHashKey>_>_>,_std::allocator<std::pair<const_int,_std::vector<Diligent::VAOCache::VAOHashKey,_std::allocator<Diligent::VAOCache::VAOHashKey>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
         ::find(&this_00->_M_h,&local_34);
  if (__it.
      super__Node_iterator_base<std::pair<const_int,_std::vector<Diligent::VAOCache::VAOHashKey,_std::allocator<Diligent::VAOCache::VAOHashKey>_>_>,_false>
      ._M_cur != (__node_type *)0x0) {
    __args = *(VAOHashKey **)
              ((long)__it.
                     super__Node_iterator_base<std::pair<const_int,_std::vector<Diligent::VAOCache::VAOHashKey,_std::allocator<Diligent::VAOCache::VAOHashKey>_>_>,_false>
                     ._M_cur + 0x10);
    pVVar1 = *(VAOHashKey **)
              ((long)__it.
                     super__Node_iterator_base<std::pair<const_int,_std::vector<Diligent::VAOCache::VAOHashKey,_std::allocator<Diligent::VAOCache::VAOHashKey>_>_>,_false>
                     ._M_cur + 0x18);
    local_40 = &this_00->_M_h;
    if (__args != pVVar1) {
      do {
        pVVar2 = local_58.
                 super__Vector_base<Diligent::VAOCache::VAOHashKey,_std::allocator<Diligent::VAOCache::VAOHashKey>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (local_58.
            super__Vector_base<Diligent::VAOCache::VAOHashKey,_std::allocator<Diligent::VAOCache::VAOHashKey>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_58.
            super__Vector_base<Diligent::VAOCache::VAOHashKey,_std::allocator<Diligent::VAOCache::VAOHashKey>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<Diligent::VAOCache::VAOHashKey,std::allocator<Diligent::VAOCache::VAOHashKey>>
          ::_M_realloc_insert<Diligent::VAOCache::VAOHashKey_const&>
                    ((vector<Diligent::VAOCache::VAOHashKey,std::allocator<Diligent::VAOCache::VAOHashKey>>
                      *)&local_58,
                     (iterator)
                     local_58.
                     super__Vector_base<Diligent::VAOCache::VAOHashKey,_std::allocator<Diligent::VAOCache::VAOHashKey>_>
                     ._M_impl.super__Vector_impl_data._M_finish,__args);
        }
        else {
          memcpy(local_58.
                 super__Vector_base<Diligent::VAOCache::VAOHashKey,_std::allocator<Diligent::VAOCache::VAOHashKey>_>
                 ._M_impl.super__Vector_impl_data._M_finish,__args,0x218);
          local_58.
          super__Vector_base<Diligent::VAOCache::VAOHashKey,_std::allocator<Diligent::VAOCache::VAOHashKey>_>
          ._M_impl.super__Vector_impl_data._M_finish = pVVar2 + 1;
        }
        std::
        _Hashtable<Diligent::VAOCache::VAOHashKey,_std::pair<const_Diligent::VAOCache::VAOHashKey,_GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLVAOCreateReleaseHelper>_>,_std::allocator<std::pair<const_Diligent::VAOCache::VAOHashKey,_GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLVAOCreateReleaseHelper>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::VAOCache::VAOHashKey>,_Diligent::VAOCache::VAOHashKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::_M_erase(&(this->m_Cache)._M_h,__args);
        __args = __args + 1;
      } while (__args != pVVar1);
    }
    std::
    _Hashtable<int,_std::pair<const_int,_std::vector<Diligent::VAOCache::VAOHashKey,_std::allocator<Diligent::VAOCache::VAOHashKey>_>_>,_std::allocator<std::pair<const_int,_std::vector<Diligent::VAOCache::VAOHashKey,_std::allocator<Diligent::VAOCache::VAOHashKey>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::erase(local_40,(const_iterator)
                     __it.
                     super__Node_iterator_base<std::pair<const_int,_std::vector<Diligent::VAOCache::VAOHashKey,_std::allocator<Diligent::VAOCache::VAOHashKey>_>_>,_false>
                     ._M_cur);
  }
  ClearStaleKeys(this,&local_58);
  Threading::SpinLock::unlock(&this->m_CacheLock);
  if (local_58.
      super__Vector_base<Diligent::VAOCache::VAOHashKey,_std::allocator<Diligent::VAOCache::VAOHashKey>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.
                    super__Vector_base<Diligent::VAOCache::VAOHashKey,_std::allocator<Diligent::VAOCache::VAOHashKey>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super__Vector_base<Diligent::VAOCache::VAOHashKey,_std::allocator<Diligent::VAOCache::VAOHashKey>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super__Vector_base<Diligent::VAOCache::VAOHashKey,_std::allocator<Diligent::VAOCache::VAOHashKey>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void VAOCache::OnDestroyPSO(const PipelineStateGLImpl& PSO)
{
    // Collect all stale keys that use this PSO.
    std::vector<VAOHashKey> StaleKeys;

    Threading::SpinLockGuard CacheGuard{m_CacheLock};

    const auto it = m_PSOToKey.find(PSO.GetUniqueID());
    if (it != m_PSOToKey.end())
    {
        for (const auto& Key : it->second)
        {
            StaleKeys.push_back(Key);
            m_Cache.erase(Key);
        }
        m_PSOToKey.erase(it);
    }

    // Clear stale entries in m_PSOToKey and m_BuffToKey that refer to dead VAOs
    // to avoid memory leaks.
    ClearStaleKeys(StaleKeys);
}